

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeTiled.cpp
# Opt level: O2

double anon_unknown.dwarf_1b803::sampleX<float>
                 (TypedImageChannel<float> *channel,int w,double x,int y,Extrapolation ext)

{
  uint x_00;
  float fVar1;
  uint x_01;
  int iVar2;
  int iVar3;
  float *pfVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  double dVar8;
  double dVar9;
  
  x_01 = Imath_3_2::floor<double>(x);
  x_00 = x_01 + 1;
  switch(ext) {
  case BLACK:
    dVar9 = 0.0;
    dVar8 = 0.0;
    if ((int)x_01 < w && -1 < (int)x_01) {
      dVar8 = (double)(channel->_pixels)._data[(long)y * (channel->_pixels)._sizeY + (ulong)x_01];
    }
    if (w <= (int)x_00 || (int)x_01 < -1) goto LAB_00108766;
    pfVar4 = (channel->_pixels)._data + (long)y * (channel->_pixels)._sizeY + (ulong)x_00;
    goto LAB_00108754;
  case CLAMP:
    uVar7 = w - 1;
    uVar5 = uVar7;
    if ((int)x_01 < (int)uVar7) {
      uVar5 = x_01;
    }
    if ((int)x_01 < 0) {
      uVar5 = 0;
    }
    if ((int)x_00 < (int)uVar7) {
      uVar7 = x_00;
    }
    if ((int)x_01 < -1) {
      uVar7 = 0;
    }
    lVar6 = (long)y * (channel->_pixels)._sizeY;
    pfVar4 = (channel->_pixels)._data;
    fVar1 = pfVar4[lVar6 + (int)uVar5];
    pfVar4 = pfVar4 + lVar6 + (int)uVar7;
    goto LAB_0010874e;
  case PERIODIC:
    iVar2 = Imath_3_2::modp(x_01,w);
    iVar3 = Imath_3_2::modp(x_00,w);
    break;
  case MIRROR:
    iVar2 = mirror(x_01,w);
    iVar3 = mirror(x_00,w);
    break;
  default:
    dVar8 = 0.0;
    dVar9 = 0.0;
    goto LAB_00108766;
  }
  lVar6 = (long)y * (channel->_pixels)._sizeY;
  pfVar4 = (channel->_pixels)._data;
  fVar1 = pfVar4[lVar6 + iVar2];
  pfVar4 = pfVar4 + lVar6 + iVar3;
LAB_0010874e:
  dVar8 = (double)fVar1;
LAB_00108754:
  dVar9 = (double)*pfVar4;
LAB_00108766:
  return ((double)(int)x_00 - x) * dVar8 + (1.0 - ((double)(int)x_00 - x)) * dVar9;
}

Assistant:

double
sampleX (
    const TypedImageChannel<T>& channel,
    int                         w,
    double                      x,
    int                         y,
    Extrapolation               ext)
{
    //
    // Sample an image channel at location (x, y), where
    // x is a floating point number, and y is an integer.
    //

    int    xs = IMATH_NAMESPACE::floor (x);
    int    xt = xs + 1;
    double s  = xt - x;
    double t  = 1 - s;
    double vs = 0.0;
    double vt = 0.0;

    switch (ext)
    {
        case BLACK:

            vs = (xs >= 0 && xs < w) ? double (channel (xs, y)) : 0.0;
            vt = (xt >= 0 && xt < w) ? double (channel (xt, y)) : 0.0;
            break;

        case CLAMP:

            xs = IMATH_NAMESPACE::clamp (xs, 0, w - 1);
            xt = IMATH_NAMESPACE::clamp (xt, 0, w - 1);
            vs = channel (xs, y);
            vt = channel (xt, y);
            break;

        case PERIODIC:

            xs = modp (xs, w);
            xt = modp (xt, w);
            vs = channel (xs, y);
            vt = channel (xt, y);
            break;

        case MIRROR:

            xs = mirror (xs, w);
            xt = mirror (xt, w);
            vs = channel (xs, y);
            vt = channel (xt, y);
            break;
    }

    return s * vs + t * vt;
}